

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlink-ipi.c
# Opt level: O2

mraa_result_t pwm_write_replace(mraa_pwm_context dev,float duty)

{
  mraa_result_t mVar1;
  undefined8 in_RAX;
  ssize_t sVar2;
  undefined8 uStack_8;
  
  if ((long)dev->pin < 9) {
    if (_fd == -1) {
      mVar1 = MRAA_ERROR_INVALID_RESOURCE;
    }
    else {
      uStack_8 = (ulong)CONCAT16((char)(long)((duty / (float)m_period) * 255.0),
                                 CONCAT15("*-036;@EJMPSV[`e"[dev->pin],(int5)in_RAX));
      sVar2 = write(_fd,(void *)((long)&uStack_8 + 5),2);
      mVar1 = MRAA_ERROR_NO_RESOURCES;
      if (sVar2 == 2) {
        mVar1 = MRAA_SUCCESS;
      }
    }
  }
  else {
    mVar1 = MRAA_ERROR_NO_RESOURCES;
  }
  return mVar1;
}

Assistant:

static mraa_result_t pwm_write_replace(mraa_pwm_context dev, float duty)
{
	unsigned char rx_tx_buf[3] = {0};

	IonValue[dev->pin] = ((duty /m_period) * 255);

	if(dev->pin < 9)
	{
		if(_fd == -1)
		{
			return MRAA_ERROR_INVALID_RESOURCE;
		}

		rx_tx_buf[0] = regIon[dev->pin];
		rx_tx_buf[1] = IonValue[dev->pin];

		if(write(_fd, &(rx_tx_buf[0]), 2) != 2)
		{
			return MRAA_ERROR_NO_RESOURCES;
		}
		return MRAA_SUCCESS;
	}
	return MRAA_ERROR_NO_RESOURCES;
}